

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_true>::fix_
          (DaTrie<false,_false,_true> *this,uint32_t node_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  uint32_t uVar1;
  reference pvVar2;
  reference this_00;
  vector<ddd::Block,_std::allocator<ddd::Block>_> *in_RDX;
  uint in_ESI;
  DaTrie<false,_false,_true> *in_RDI;
  DaTrie<false,_false,_true> *in_stack_00000010;
  uint32_t prev;
  uint32_t next;
  uint32_t block_pos;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  
  while( true ) {
    uVar1 = num_blocks((DaTrie<false,_false,_true> *)0x16b791);
    if (in_ESI >> 8 < uVar1) break;
    push_block_(in_stack_00000010);
  }
  in_RDI->bc_emps_ = in_RDI->bc_emps_ - 1;
  pvVar2 = std::vector<ddd::Block,_std::allocator<ddd::Block>_>::operator[]
                     (in_RDX,(ulong)(in_ESI >> 8));
  pvVar2->num_emps = pvVar2->num_emps - 1;
  if (in_RDI->bc_emps_ == 0) {
    in_RDI->head_pos_ = 0xffffffff;
  }
  else {
    if (in_ESI == in_RDI->head_pos_) {
      uVar1 = next_(in_RDI,in_stack_ffffffffffffffcc);
      in_RDI->head_pos_ = uVar1;
    }
    next_(in_RDI,in_stack_ffffffffffffffcc);
    prev_(in_RDI,in_stack_ffffffffffffffcc);
    set_next_(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    set_prev_(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  this_00 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)in_ESI);
  Bc::fix(this_00);
  return;
}

Assistant:

void fix_(uint32_t node_pos, std::vector<Block>& blocks) {
    auto block_pos = node_pos / BLOCK_SIZE;
    while (num_blocks() <= block_pos) {
      push_block_();
    }

    assert(node_pos < bc_.size());
    assert(!bc_[node_pos].is_fixed());

    --bc_emps_;
    --blocks[block_pos].num_emps;

    if (bc_emps_ == 0) {
      head_pos_ = NOT_FOUND;
    } else {
      if (node_pos == head_pos_) {
        head_pos_ = next_(head_pos_);
      }
      auto next = next_(node_pos);
      auto prev = prev_(node_pos);
      set_next_(prev, next);
      set_prev_(next, prev);
    }
    bc_[node_pos].fix();
  }